

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::reorg_gradient
               (bool add_to,tensor *grad,int row_stride,int col_stride,tensor *gradient_input)

{
  enable_if_t<std::is_convertible<tensor_*,_tensor_*>::value____std::is_convertible<tensor_*,_tensor_*>::value,_bool>
  eVar1;
  longlong lVar2;
  ostream *poVar3;
  undefined8 uVar4;
  longlong lVar5;
  ostream *poVar6;
  string *a;
  int in_ECX;
  int in_EDX;
  tensor *in_RSI;
  byte in_DIL;
  tensor *in_R8;
  float *g;
  float *gi;
  ostringstream dlib_o_out_6;
  ostringstream dlib_o_out_5;
  ostringstream dlib_o_out_4;
  ostringstream dlib_o_out_3;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  long in_stack_fffffffffffff168;
  anon_class_56_7_7c6c4572 *in_stack_fffffffffffff170;
  long in_stack_fffffffffffff178;
  string *in_stack_fffffffffffff180;
  undefined8 in_stack_fffffffffffff188;
  error_type eVar7;
  fatal_error *in_stack_fffffffffffff190;
  ostringstream local_b68 [383];
  undefined1 local_9e9;
  ostringstream local_9c8 [383];
  undefined1 local_849;
  ostringstream local_828 [383];
  undefined1 local_6a9;
  ostringstream local_688 [383];
  undefined1 local_509;
  ostringstream local_4e8 [383];
  undefined1 local_369;
  ostringstream local_348 [383];
  undefined1 local_1c9;
  ostringstream local_198 [376];
  tensor *local_20;
  int local_18;
  int local_14;
  tensor *local_10;
  byte local_1;
  
  eVar7 = (error_type)((ulong)in_stack_fffffffffffff188 >> 0x20);
  local_1 = in_DIL & 1;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  eVar1 = is_same_object<dlib::tensor,dlib::tensor>(in_RSI,in_R8);
  if (eVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98a);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_198,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_198,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_198,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"!is_same_object(grad, gradient_input)");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_198,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"Grad and gradient_input must be distinct objects.");
    std::operator<<(poVar3,"\n");
    local_1c9 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff190,eVar7,in_stack_fffffffffffff180);
    local_1c9 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar2 = tensor::nr(local_10);
  if (lVar2 % (long)local_14 != 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_348);
    poVar3 = std::operator<<((ostream *)local_348,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98b);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_348,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_348,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_348,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"grad.nr() % row_stride == 0");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_348,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"The number of rows in grad must be divisible by row_stride.");
    std::operator<<(poVar3,"\n");
    local_369 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff190,eVar7,in_stack_fffffffffffff180);
    local_369 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar2 = tensor::nc(local_10);
  if (lVar2 % (long)local_18 != 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_4e8);
    poVar3 = std::operator<<((ostream *)local_4e8,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98c);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_4e8,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_4e8,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_4e8,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"grad.nc() % col_stride == 0");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_4e8,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"The number of columns in grad must be divisible by col_stride."
                            );
    std::operator<<(poVar3,"\n");
    local_509 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff190,eVar7,in_stack_fffffffffffff180);
    local_509 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar2 = tensor::num_samples(local_10);
  lVar5 = tensor::num_samples(local_20);
  if (lVar2 != lVar5) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_688);
    poVar3 = std::operator<<((ostream *)local_688,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98d);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_688,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_688,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_688,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"grad.num_samples() == gradient_input.num_samples()");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_688,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"The number of samples in grad and gradient_input must match.");
    std::operator<<(poVar3,"\n");
    local_6a9 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff190,eVar7,in_stack_fffffffffffff180);
    local_6a9 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar2 = tensor::k(local_10);
  lVar5 = tensor::k(local_20);
  if (lVar2 != (lVar5 / (long)local_14) / (long)local_18) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_828);
    poVar3 = std::operator<<((ostream *)local_828,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98e);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_828,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_828,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_828,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"grad.k() == gradient_input.k() / row_stride / col_stride");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_828,std::boolalpha);
    poVar3 = std::operator<<(poVar3,
                             "The number of channels in grad must be gradient_input.k() divided by row_stride and col_stride."
                            );
    std::operator<<(poVar3,"\n");
    local_849 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff190,eVar7,in_stack_fffffffffffff180);
    local_849 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar2 = tensor::nr(local_10);
  lVar5 = tensor::nr(local_20);
  if (lVar2 != lVar5 * local_14) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_9c8);
    poVar3 = std::operator<<((ostream *)local_9c8,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98f);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_9c8,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_9c8,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_9c8,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"grad.nr() == gradient_input.nr() * row_stride");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_9c8,std::boolalpha);
    poVar3 = std::operator<<(poVar3,
                             "The number of rows in grad must be gradient_input.nr() multiplied by row_stride."
                            );
    std::operator<<(poVar3,"\n");
    local_9e9 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff190,eVar7,in_stack_fffffffffffff180);
    local_9e9 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar2 = tensor::nc(local_10);
  lVar5 = tensor::nc(local_20);
  if (lVar2 != lVar5 * local_18) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_b68);
    poVar3 = std::operator<<((ostream *)local_b68,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x990);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_b68,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_b68,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar6 = std::operator<<((ostream *)local_b68,"Failing expression was ");
    a = (string *)std::operator<<(poVar6,"grad.nc() == gradient_input.nc() * col_stride");
    eVar7 = (error_type)((ulong)poVar6 >> 0x20);
    std::operator<<((ostream *)a,".\n");
    poVar6 = (ostream *)std::ostream::operator<<(local_b68,std::boolalpha);
    poVar6 = std::operator<<(poVar6,
                             "The number of columns in grad must be gradient_input.nc() multiplied by col_stride."
                            );
    std::operator<<(poVar6,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar3,eVar7,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  (*local_20->_vptr_tensor[2])();
  (*local_10->_vptr_tensor[3])();
  tensor::num_samples(local_20);
  parallel_for<dlib::cpu::reorg_gradient(bool,dlib::tensor&,int,int,dlib::tensor_const&)::__0>
            ((long)in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
             in_stack_fffffffffffff168);
  return;
}

Assistant:

void reorg_gradient(
            bool add_to,
            tensor& grad,
            const int row_stride,
            const int col_stride,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(!is_same_object(grad, gradient_input), "Grad and gradient_input must be distinct objects.");
            DLIB_CASSERT(grad.nr() % row_stride == 0, "The number of rows in grad must be divisible by row_stride.");
            DLIB_CASSERT(grad.nc() % col_stride == 0, "The number of columns in grad must be divisible by col_stride.");
            DLIB_CASSERT(grad.num_samples() == gradient_input.num_samples(), "The number of samples in grad and gradient_input must match.");
            DLIB_CASSERT(grad.k() == gradient_input.k() / row_stride / col_stride, "The number of channels in grad must be gradient_input.k() divided by row_stride and col_stride.");
            DLIB_CASSERT(grad.nr() == gradient_input.nr() * row_stride, "The number of rows in grad must be gradient_input.nr() multiplied by row_stride.");
            DLIB_CASSERT(grad.nc() == gradient_input.nc() * col_stride, "The number of columns in grad must be gradient_input.nc() multiplied by col_stride.");

            const float* gi = gradient_input.host();
            float* g = grad.host();

            parallel_for(0, gradient_input.num_samples(), [&](long n)
            {
                for (long k = 0; k < gradient_input.k(); ++k)
                {
                    for (long r = 0; r < gradient_input.nr(); ++r)
                    {
                        for (long c = 0; c < gradient_input.nc(); ++c)
                        {
                                const auto in_idx = tensor_index(gradient_input, n, k, r, c);
                                const auto out_idx = tensor_index(grad,
                                    n,
                                    k % grad.k(),
                                    r * row_stride + (k / grad.k()) / col_stride,
                                    c * col_stride + (k / grad.k()) % col_stride);
                                
                                if (add_to) g[out_idx] += gi[in_idx];
                                else g[out_idx] = gi[in_idx];
                        }
                    }
                }
            });
        }